

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

void uv__run_pending(uv_loop_t *loop)

{
  uv__queue *puVar1;
  uv__queue *puVar2;
  uv__queue pq;
  
  pq.next = &pq;
  puVar1 = (loop->pending_queue).next;
  if (puVar1 != &loop->pending_queue) {
    pq.prev = (loop->pending_queue).prev;
    (pq.prev)->next = &pq;
    puVar2 = puVar1->prev;
    (loop->pending_queue).prev = puVar2;
    puVar2->next = &loop->pending_queue;
    pq.next = puVar1;
  }
  (pq.next)->prev = &pq;
  while (puVar1 = pq.next, pq.next != &pq) {
    puVar2 = (pq.next)->next;
    (pq.next)->prev->next = puVar2;
    puVar2->prev = (pq.next)->prev;
    (pq.next)->next = pq.next;
    puVar1->prev = puVar1;
    (*(code *)puVar1[-1].prev)(loop,&puVar1[-1].prev,4);
  }
  return;
}

Assistant:

static void uv__run_pending(uv_loop_t* loop) {
  struct uv__queue* q;
  struct uv__queue pq;
  uv__io_t* w;

  uv__queue_move(&loop->pending_queue, &pq);

  while (!uv__queue_empty(&pq)) {
    q = uv__queue_head(&pq);
    uv__queue_remove(q);
    uv__queue_init(q);
    w = uv__queue_data(q, uv__io_t, pending_queue);
    w->cb(loop, w, POLLOUT);
  }
}